

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O2

bool __thiscall wasm::IString::operator<(IString *this,IString *other)

{
  bool bVar1;
  
  bVar1 = std::operator<(this->str,other->str);
  return bVar1;
}

Assistant:

bool operator<(const IString& other) const { return str < other.str; }